

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<32U>::decodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong in_RCX;
  uint *in_RSI;
  long *in_R8;
  uint32_t i;
  uint32_t Bs [4];
  uint32_t *initout;
  uint32_t actuallength;
  uint bit;
  ulong local_20;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  uVar1 = *in_RSI;
  for (local_20 = in_RCX; local_20 < in_RCX + (ulong)uVar1 * 4; local_20 = local_20 + 0x200) {
    uVar2 = *local_10 >> 0x18;
    uVar3 = *local_10 >> 0x10 & 0xff;
    uVar4 = *local_10 >> 8 & 0xff;
    uVar5 = *local_10 & 0xff;
    local_10 = local_10 + 1;
    for (bit = 0; bit < 4; bit = bit + 1) {
      fastunpack((uint32_t *)CONCAT44(uVar5,uVar4),(uint32_t *)CONCAT44(uVar3,uVar2),bit);
      local_10 = local_10 + *(uint *)(&stack0xffffffffffffffb8 + (ulong)bit * 4);
    }
  }
  *in_R8 = (long)(local_20 - in_RCX) >> 2;
  return local_10;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }